

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsortA.c
# Opt level: O0

int bursttraverseA(TRIE_conflict *node,string *strings,int pos,unsigned_short deep)

{
  int iVar1;
  ushort uVar2;
  char **ppcStack_48;
  int count;
  char **headbucket;
  char **nullbucket;
  int iStack_30;
  unsigned_short no_elements_in_bucket;
  unsigned_short no_elements_in_last_bucket;
  unsigned_short no_of_buckets;
  int off;
  int k;
  int j;
  int i;
  unsigned_short deep_local;
  int pos_local;
  string *strings_local;
  TRIE_conflict *node_local;
  
  i = pos;
  for (k = 0; k < 0x100; k = k + 1) {
    iVar1 = node->counts[k];
    if (iVar1 == -1) {
      i = bursttraverseA((TRIE_conflict *)node->ptrs[k],strings,i,deep + 1);
    }
    else if (iVar1 != 0) {
      if (k == 0) {
        uVar2 = (short)(iVar1 / 0x1fff) + 1;
        headbucket = node->ptrs[0];
        iStack_30 = i;
        ppcStack_48 = node->ptrs[0];
        for (_no_elements_in_last_bucket = 1; (int)_no_elements_in_last_bucket <= (int)(uint)uVar2;
            _no_elements_in_last_bucket = _no_elements_in_last_bucket + 1) {
          nullbucket._2_2_ = (ushort)(iVar1 % 0x1fff);
          if (_no_elements_in_last_bucket != uVar2) {
            nullbucket._2_2_ = 0x1fff;
          }
          for (off = 0; off < (int)(uint)nullbucket._2_2_; off = off + 1) {
            strings[iStack_30] = (string)headbucket[off];
            iStack_30 = iStack_30 + 1;
          }
          headbucket = (char **)headbucket[off];
          free(ppcStack_48);
          ppcStack_48 = headbucket;
        }
      }
      else {
        iStack_30 = i;
        for (off = 0; off < iVar1; off = off + 1) {
          strings[iStack_30] = (string)node->ptrs[k][off];
          iStack_30 = iStack_30 + 1;
        }
        free(node->ptrs[k]);
        if (1 < iVar1) {
          if (iVar1 < 0x14) {
            inssort(strings + i,iStack_30 - i,deep + 1);
          }
          else {
            mkqsort(strings + i,iStack_30 - i,deep + 1);
          }
        }
      }
      i = iStack_30;
    }
  }
  free(node);
  return i;
}

Assistant:

static int
bursttraverseA(TRIE *node, string strings[], int pos, unsigned short deep)
{
    int i, j, k; 
    int off = 0;
    unsigned short no_of_buckets=0, no_elements_in_last_bucket=0, no_elements_in_bucket=0; 
    char **nullbucket, **headbucket;
    int count;

    for( i=0 ; i < ALPHABET; i++)
    {
        count = node->counts[i];

        if( !++count )
        {
            pos = bursttraverseA((TRIE *) node->ptrs[i], strings, pos, deep+1);
        }
        else if (--count)
        {
            if(i==0)
            {
                no_of_buckets = (count/THRESHOLDMINUSONE) + 1;
                no_elements_in_last_bucket = count % THRESHOLDMINUSONE;
                nullbucket = node->ptrs[i];
                headbucket = node->ptrs[i];
                off=pos;

                /* traverse all arrays in the bucket */
                for (k=1; k <= no_of_buckets; k++)
                {
                    if(k==no_of_buckets)
                        no_elements_in_bucket = no_elements_in_last_bucket;
                    else
                        no_elements_in_bucket = THRESHOLDMINUSONE;

                    /* traverse all elements in each bucket */
                    for (j=0; j < no_elements_in_bucket ; j++, off++) 
                    {
			strings[off] = (unsigned char*) nullbucket[j];
                    }
                    nullbucket = (char **) nullbucket[j];
                    free(headbucket);
                    headbucket = nullbucket;
                }
            }
            else
            {
                for( j=0, off=pos ; j < count ; j++, off++)
                    strings[off] = (unsigned char*) node->ptrs[i][j];

                free( node->ptrs[i] );

                if (count > 1)
                {
                    if (count < INSERTBREAK)
                        inssort( strings+pos, off-pos, deep + 1);  
                    else
                        mkqsort( strings+pos, off-pos, deep + 1);
                }
            }
            pos = off;
        }
    }
    free(node);
    return pos; 
}